

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O0

void __thiscall xmrig::OclSharedData::setRunTime(OclSharedData *this,uint64_t time)

{
  undefined8 in_RSI;
  mutex_type *in_RDI;
  undefined1 auVar1 [16];
  lock_guard<std::mutex> lock;
  double averagingBias;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  auVar1._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar1._0_8_ = in_RSI;
  auVar1._12_4_ = 0x45300000;
  *(double *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) =
       *(double *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) * 0.9 +
       ((auVar1._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) * 0.1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2192c0);
  return;
}

Assistant:

void xmrig::OclSharedData::setRunTime(uint64_t time)
{
    // averagingBias = 1.0 - only the last delta time is taken into account
    // averagingBias = 0.5 - the last delta time has the same weight as all the previous ones combined
    // averagingBias = 0.1 - the last delta time has 10% weight of all the previous ones combined
    constexpr double averagingBias = 0.1;

    std::lock_guard<std::mutex> lock(m_mutex);
    m_averageRunTime = m_averageRunTime * (1.0 - averagingBias) + time * averagingBias;
}